

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O2

Value __thiscall GuiScope::getValue(GuiScope *this,string *name,int comps)

{
  iterator iVar1;
  float *pfVar2;
  mapped_type *pmVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Value VVar6;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->vars_)._M_h,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->vars_,name);
    pmVar3->components = comps;
    uVar4 = 0;
    uVar5 = 0;
    (pmVar3->value).x = 0.0;
    (pmVar3->value).y = 0.0;
    (pmVar3->value).z = 0.0;
    (pmVar3->value).w = 0.0;
    pfVar2 = &(pmVar3->value).z;
  }
  else {
    *(int *)((long)iVar1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
                   ._M_cur + 0x28) = comps;
    uVar4 = (undefined4)
            *(undefined8 *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
                    ._M_cur + 0x2c);
    uVar5 = (undefined4)
            ((ulong)*(undefined8 *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
                            ._M_cur + 0x2c) >> 0x20);
    pfVar2 = (float *)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
                             ._M_cur + 0x34);
  }
  VVar6.y = (float)uVar5;
  VVar6.x = (float)uVar4;
  VVar6._8_8_ = *(undefined8 *)pfVar2;
  return VVar6;
}

Assistant:

Value GuiScope::getValue(const std::string& name, int comps) {
	auto it = vars_.find(name);
	if (it != vars_.end()) {
		it->second.components = comps;
		return it->second.value;
	}

	return (vars_[name] = Variable{comps, Value{0}}).value;
}